

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O0

int __thiscall HighFreqPub::initialize(HighFreqPub *this,string *addr,int port)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  zsock_t *pzVar4;
  undefined8 uVar5;
  undefined4 in_EDX;
  string *in_RSI;
  string *in_RDI;
  int aPort;
  string newAddress;
  string front;
  char *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  string local_f8 [20];
  int in_stack_ffffffffffffff1c;
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [48];
  string local_60 [32];
  string local_40 [36];
  undefined4 local_1c;
  int local_4;
  
  local_1c = in_EDX;
  bVar1 = std::operator==(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  if (bVar1) {
    std::__cxx11::string::operator=(in_RSI,"tcp://127.0.0.1");
    local_1c = 0xc001;
  }
  std::__cxx11::string::operator=(in_RDI,in_RSI);
  psVar3 = (string *)std::__cxx11::string::append((char *)in_RSI);
  std::__cxx11::string::string(local_40,psVar3);
  std::__cxx11::string::string(local_60,local_40);
  std::__cxx11::to_string(in_stack_ffffffffffffff1c);
  std::operator+((char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                 in_stack_fffffffffffffed0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                 (char *)in_stack_fffffffffffffed0);
  std::__cxx11::string::operator+=(local_60,local_90);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_d0);
  pzVar4 = zsock_new_checked(1,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/SpikeGadgets[P]TrodesNetwork/src/libTrodesNetwork/src/highfreqclasses.cpp"
                             ,0x21);
  *(zsock_t **)(in_RDI + 0x20) = pzVar4;
  pzVar4 = *(zsock_t **)(in_RDI + 0x20);
  uVar5 = std::__cxx11::string::c_str();
  iVar2 = zsock_bind(pzVar4,"%s",uVar5);
  if (iVar2 == -1) {
    local_4 = -1;
  }
  else {
    std::__cxx11::to_string(in_stack_ffffffffffffff1c);
    psVar3 = (string *)std::__cxx11::string::append(local_40);
    std::__cxx11::string::operator=(in_RDI,psVar3);
    std::__cxx11::string::~string(local_f8);
    local_4 = 0;
  }
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_40);
  return local_4;
}

Assistant:

int HighFreqPub::initialize(std::string addr, int port) {
    if(addr == ""){
        addr = "tcp://127.0.0.1";
        port = 49153;
    }
    sockEndpoint = addr;
    std::string front = addr.append(":");
    std::string newAddress = front;
    newAddress += "*[" + std::to_string(port) + "-]"; // zsock_bind() takes in a port value of *[p-], which means bind to first available port starting at "p"
    hfPub = zsock_new(ZMQ_PUB);
    int aPort = zsock_bind(hfPub, "%s", newAddress.c_str()); //%s just reducing warnings, one at a time
    if(aPort == -1){
        return -1;
    }
    sockEndpoint = front.append(std::to_string(aPort));
    return 0;
}